

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg4.cc
# Opt level: O1

void __thiscall trng::mrg4::mrg4(mrg4 *this,unsigned_long s,parameter_type P)

{
  int iVar1;
  int iVar2;
  
  *(long *)(this->P).a = P.a._0_8_;
  *(long *)((this->P).a + 2) = P.a._8_8_;
  (this->S).r[0] = 0;
  (this->S).r[1] = 1;
  (this->S).r[2] = 1;
  (this->S).r[3] = 1;
  iVar1 = (int)((long)s % 0x7fffffff);
  iVar2 = iVar1 + 0x7fffffff;
  if (-1 < (long)s % 0x7fffffff) {
    iVar2 = iVar1;
  }
  (this->S).r[0] = iVar2;
  (this->S).r[1] = 1;
  (this->S).r[2] = 1;
  (this->S).r[3] = 1;
  return;
}

Assistant:

mrg4::mrg4(unsigned long s, mrg4::parameter_type P) : P{P} { seed(s); }